

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

char * cmTargetPropertyComputer::ComputeLocationForBuild<cmTarget>(cmTarget *tgt)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  size_type sVar2;
  cmGlobalGenerator *this;
  cmGeneratorTarget *this_00;
  char *__s;
  string local_58;
  string local_38;
  
  if (ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_ == '\0') {
    ComputeLocationForBuild<cmTarget>();
  }
  _Var1._M_head_impl =
       (tgt->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->IsImportedTarget == true) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    cmTarget::ImportedGetFullPath(&local_38,tgt,&local_58,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=
              ((string *)&ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_,
               (string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    this = cmMakefile::GetGlobalGenerator((_Var1._M_head_impl)->Makefile);
    if (this->ConfigureDoneCMP0026AndCMP0024 == false) {
      cmGlobalGenerator::CreateGenerationObjects(this,AllTargets);
    }
    this_00 = cmGlobalGenerator::FindGeneratorTarget
                        (this,&((tgt->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               Name);
    __s = cmGeneratorTarget::GetLocationForBuild(this_00);
    sVar2 = ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace(0x6abaa8,0,(char *)sVar2,(ulong)__s);
  }
  return ComputeLocationForBuild<cmTarget>(cmTarget_const*)::loc_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char* cmTargetPropertyComputer::ComputeLocationForBuild<cmTarget>(
  cmTarget const* tgt)
{
  static std::string loc;
  if (tgt->IsImported()) {
    loc = tgt->ImportedGetFullPath("", cmStateEnums::RuntimeBinaryArtifact);
    return loc.c_str();
  }

  cmGlobalGenerator* gg = tgt->GetGlobalGenerator();
  if (!gg->GetConfigureDoneCMP0026()) {
    gg->CreateGenerationObjects();
  }
  cmGeneratorTarget* gt = gg->FindGeneratorTarget(tgt->GetName());
  loc = gt->GetLocationForBuild();
  return loc.c_str();
}